

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  ImVector<ImFontAtlasCustomRect> *this;
  unsigned_short uVar1;
  stbrp_coord sVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  ImFontAtlasCustomRect *pIVar6;
  stbrp_rect *psVar7;
  int i;
  int iVar8;
  ImVector<stbrp_rect> pack_rects;
  ImVector<stbrp_rect> local_48;
  
  if (stbrp_context_opaque == (void *)0x0) {
    __assert_fail("pack_context != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_draw.cpp"
                  ,0x848,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  iVar8 = (atlas->CustomRects).Size;
  if (iVar8 < 1) {
    __assert_fail("user_rects.Size >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_draw.cpp"
                  ,0x84b,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  local_48.Size = 0;
  local_48.Capacity = 0;
  local_48.Data = (stbrp_rect *)0x0;
  ImVector<stbrp_rect>::resize(&local_48,iVar8);
  this = &atlas->CustomRects;
  memset(local_48.Data,0,(long)local_48.Size << 4);
  for (iVar8 = 0; iVar8 < this->Size; iVar8 = iVar8 + 1) {
    pIVar6 = ImVector<ImFontAtlasCustomRect>::operator[](this,iVar8);
    uVar1 = pIVar6->Width;
    psVar7 = ImVector<stbrp_rect>::operator[](&local_48,iVar8);
    psVar7->w = uVar1;
    pIVar6 = ImVector<ImFontAtlasCustomRect>::operator[](this,iVar8);
    uVar1 = pIVar6->Height;
    psVar7 = ImVector<stbrp_rect>::operator[](&local_48,iVar8);
    psVar7->h = uVar1;
  }
  iVar8 = 0;
  psVar7 = ImVector<stbrp_rect>::operator[](&local_48,0);
  stbrp_pack_rects((stbrp_context *)stbrp_context_opaque,psVar7,local_48.Size);
  do {
    if (local_48.Size <= iVar8) {
      ImVector<stbrp_rect>::~ImVector(&local_48);
      return;
    }
    psVar7 = ImVector<stbrp_rect>::operator[](&local_48,iVar8);
    if (psVar7->was_packed != 0) {
      psVar7 = ImVector<stbrp_rect>::operator[](&local_48,iVar8);
      sVar2 = psVar7->x;
      pIVar6 = ImVector<ImFontAtlasCustomRect>::operator[](this,iVar8);
      pIVar6->X = sVar2;
      psVar7 = ImVector<stbrp_rect>::operator[](&local_48,iVar8);
      sVar2 = psVar7->y;
      pIVar6 = ImVector<ImFontAtlasCustomRect>::operator[](this,iVar8);
      pIVar6->Y = sVar2;
      psVar7 = ImVector<stbrp_rect>::operator[](&local_48,iVar8);
      sVar2 = psVar7->w;
      pIVar6 = ImVector<ImFontAtlasCustomRect>::operator[](this,iVar8);
      if (sVar2 != pIVar6->Width) {
LAB_0015c8e9:
        __assert_fail("pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_draw.cpp"
                      ,0x85b,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
      }
      psVar7 = ImVector<stbrp_rect>::operator[](&local_48,iVar8);
      sVar2 = psVar7->h;
      pIVar6 = ImVector<ImFontAtlasCustomRect>::operator[](this,iVar8);
      if (sVar2 != pIVar6->Height) goto LAB_0015c8e9;
      iVar4 = atlas->TexHeight;
      psVar7 = ImVector<stbrp_rect>::operator[](&local_48,iVar8);
      uVar3 = psVar7->y;
      psVar7 = ImVector<stbrp_rect>::operator[](&local_48,iVar8);
      iVar5 = (uint)psVar7->h + (uint)uVar3;
      if (iVar5 < iVar4) {
        iVar5 = iVar4;
      }
      atlas->TexHeight = iVar5;
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;
    IM_ASSERT(pack_context != NULL);

    ImVector<ImFontAtlasCustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = pack_rects[i].x;
            user_rects[i].Y = pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}